

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ElementUnsigned1
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,uint32 Element)

{
  code *pcVar1;
  bool bVar2;
  RegSlot Value_00;
  RegSlot Instance_00;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  uint32 local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x31);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = Instance;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5a1,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00890b03;
    *puVar3 = 0;
    Instance = local_34;
  }
  if (Value != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = Element;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00890b03;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
      Element = local_34;
    }
    Value_00 = FunctionBody::MapRegSlot(pFVar4,Value);
    if (Instance != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 != (FunctionBody *)0x0) {
LAB_00890a2d:
        Instance_00 = FunctionBody::MapRegSlot(pFVar4,Instance);
        bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op,Value_00,Instance_00,Element);
        if (!bVar2) {
          bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,op,Value_00,Instance_00,Element);
          if (!bVar2) {
            local_40 = Element;
            local_3c = Value_00;
            local_38 = Instance_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      local_34 = Element;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
        Element = local_34;
        goto LAB_00890a2d;
      }
      goto LAB_00890b03;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_00890b03:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ElementUnsigned1(OpCode op, RegSlot Value, RegSlot Instance, uint32 Element)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementUnsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);

        MULTISIZE_LAYOUT_WRITE(ElementUnsigned1, op, Value, Instance, Element);
    }